

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_async_generator_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  int iVar1;
  JSValueUnion *s;
  JSValue JVar2;
  
  s = (JSValueUnion *)js_mallocz(ctx,0x88);
  if (s != (JSValueUnion *)0x0) {
    s[1].int32 = JS_ASYNC_GENERATOR_STATE_SUSPENDED_START;
    s[0xf].ptr = s + 0xf;
    s[0x10].ptr = s + 0xf;
    iVar1 = async_func_init(ctx,(JSAsyncFunctionState *)(s + 2),func_obj,this_obj,argc,argv);
    if (iVar1 == 0) {
      JVar2 = async_func_resume(ctx,(JSAsyncFunctionState *)(s + 2));
      if ((uint)JVar2.tag != 6) {
        if ((0xfffffff4 < (uint)JVar2.tag) &&
           (iVar1 = *JVar2.u.ptr, *(int *)JVar2.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar2);
        }
        JVar2 = js_create_from_ctor(ctx,func_obj,0x32);
        if ((JVar2.tag & 0xffffffffU) != 6) {
          s->ptr = (void *)JVar2.u;
          if ((int)JVar2.tag == -1) {
            *(JSValueUnion **)((long)JVar2.u.ptr + 0x30) = s;
            return JVar2;
          }
          return JVar2;
        }
      }
    }
    else {
      s[1].int32 = JS_ASYNC_GENERATOR_STATE_COMPLETED;
    }
    js_async_generator_free(ctx->rt,(JSAsyncGeneratorData *)s);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_async_generator_function_call(JSContext *ctx, JSValueConst func_obj,
                                                JSValueConst this_obj,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSValue obj, func_ret;
    JSAsyncGeneratorData *s;

    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        return JS_EXCEPTION;
    s->state = JS_ASYNC_GENERATOR_STATE_SUSPENDED_START;
    init_list_head(&s->queue);
    if (async_func_init(ctx, &s->func_state, func_obj, this_obj, argc, argv)) {
        s->state = JS_ASYNC_GENERATOR_STATE_COMPLETED;
        goto fail;
    }

    /* execute the function up to 'OP_initial_yield' (no yield nor
       await are possible) */
    func_ret = async_func_resume(ctx, &s->func_state);
    if (JS_IsException(func_ret))
        goto fail;
    JS_FreeValue(ctx, func_ret);

    obj = js_create_from_ctor(ctx, func_obj, JS_CLASS_ASYNC_GENERATOR);
    if (JS_IsException(obj))
        goto fail;
    s->generator = JS_VALUE_GET_OBJ(obj);
    JS_SetOpaque(obj, s);
    return obj;
 fail:
    js_async_generator_free(ctx->rt, s);
    return JS_EXCEPTION;
}